

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale-test.cc
# Opt level: O3

void __thiscall LocaleTest_Format_Test::TestBody(LocaleTest_Format_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unsigned_long_long uVar2;
  bool bVar3;
  numpunct<char> *__f;
  char *pcVar4;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_string_view<char> format_str_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  args_02;
  AssertionResult gtest_ar_2;
  string s;
  locale loc;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_int>
  as;
  locale local_70;
  AssertHelper local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  locale local_30;
  undefined8 local_28;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertHelper local_18;
  
  std::locale::locale((locale *)&local_50);
  __f = (numpunct<char> *)operator_new(0x18);
  *(undefined8 *)__f = 0;
  *(undefined8 *)&__f->field_0x8 = 0;
  *(undefined8 *)&__f->field_0x10 = 0;
  std::__cxx11::numpunct<char>::numpunct((ulong)__f);
  *(undefined ***)__f = &PTR__numpunct_00176ef0;
  std::locale::locale<numpunct<char>>(&local_30,(locale *)&local_50,__f);
  std::locale::~locale((locale *)&local_50);
  std::locale::locale(&local_70);
  local_68.data_ = (AssertHelperData *)0x12d687;
  format_str.size_ = 4;
  format_str.data_ = "{:n}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_68;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                ::TYPES;
  fmt::v5::internal::vformat<char>(&local_50,&local_70,format_str,args);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&local_28,"\"1,234,567\"","fmt::format(std::locale(), \"{:n}\", 1234567)",
             (char (*) [10])"1,234,567",&local_50);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::locale::~locale(&local_70);
  if (local_28._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x13,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.data_ = (AssertHelperData *)0x12d687;
  format_str_00.size_ = 4;
  format_str_00.data_ = "{:n}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_68;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  fmt::v5::internal::vformat<char>(&local_50,&local_30,format_str_00,args_00);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&local_28,"\"1~234~567\"","fmt::format(loc, \"{:n}\", 1234567)",
             (char (*) [10])"1~234~567",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_28._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x14,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28 = 0x12d687;
  format_str_01.size_ = 4;
  format_str_01.data_ = "{:n}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_28;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  fmt::v5::internal::vformat<char>(&local_50,&local_30,format_str_01,args_01);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&local_68,"\"1~234~567\"",
             "fmt::vformat(loc, \"{:n}\", fmt::format_args(as))",(char (*) [10])"1~234~567",
             &local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_68.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_60[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_60[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x16,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar2 = fmt::v5::
          format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::string>,char>,int>
          ::TYPES;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_68.data_ = (AssertHelperData *)0x12d687;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  fmt::v5::internal::locale_ref::locale_ref<std::locale>((locale_ref *)&local_70,&local_30);
  format_str_02.size_ = 4;
  format_str_02.data_ = "{:n}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *)&local_68;
  args_02.types_ = uVar2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::string>,char>>
            ((range)&local_50,format_str_02,args_02,(locale_ref)local_70._M_impl);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&local_68,"\"1~234~567\"","s",(char (*) [10])"1~234~567",&local_50);
  if (local_68.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_60[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_60[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x19,pcVar4);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if (local_70._M_impl != (_Impl *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70._M_impl != (_Impl *)0x0)) {
        (**(code **)(*(long *)local_70._M_impl + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::locale::~locale(&local_30);
  return;
}

Assistant:

TEST(LocaleTest, Format) {
  std::locale loc(std::locale(), new numpunct<char>());
  EXPECT_EQ("1,234,567", fmt::format(std::locale(), "{:n}", 1234567));
  EXPECT_EQ("1~234~567", fmt::format(loc, "{:n}", 1234567));
  fmt::format_arg_store<fmt::format_context, int> as{1234567};
  EXPECT_EQ("1~234~567", fmt::vformat(loc, "{:n}", fmt::format_args(as)));
  std::string s;
  fmt::format_to(std::back_inserter(s), loc, "{:n}", 1234567);
  EXPECT_EQ("1~234~567", s);
}